

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

void Spl_ManComputeOneTest(Gia_Man_t *pGia)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vRoots;
  Vec_Int_t *vAnds;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  Gia_ManComputeOneWinStart(pGia,0x40,0);
  if (1 < pGia->nObjs) {
    uVar3 = 1;
    lVar2 = 0x14;
    do {
      if ((long)pGia->vMapping2->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*(int *)((long)&pGia->vMapping2->pArray->nCap + lVar2) != 0) {
        uVar1 = Gia_ManComputeOneWin(pGia,(int)uVar3,&local_40,&local_48,&local_50,&local_38);
        printf("Obj = %6d : Leaf = %2d.  Node = %2d.  Root = %2d.    AND = %3d.\n",
               uVar3 & 0xffffffff,(ulong)(uint)local_50->nSize,(ulong)(uint)local_48->nSize,
               (ulong)(uint)local_40->nSize,(ulong)uVar1);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while ((long)uVar3 < (long)pGia->nObjs);
  }
  if ((Spl_Man_t *)pGia->pSatlutWinman != (Spl_Man_t *)0x0) {
    Spl_ManStop((Spl_Man_t *)pGia->pSatlutWinman);
    pGia->pSatlutWinman = (void *)0x0;
    return;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                ,0x207,
                "int Gia_ManComputeOneWin(Gia_Man_t *, int, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
               );
}

Assistant:

void Spl_ManComputeOneTest( Gia_Man_t * pGia )
{
    int iLut, Count;
    Gia_ManComputeOneWinStart( pGia, 64, 0 );
    Gia_ManForEachLut2( pGia, iLut )
    {
        Vec_Int_t * vRoots, * vNodes, * vLeaves, * vAnds;
        Count = Gia_ManComputeOneWin( pGia, iLut, &vRoots, &vNodes, &vLeaves, &vAnds );
        printf( "Obj = %6d : Leaf = %2d.  Node = %2d.  Root = %2d.    AND = %3d.\n", 
            iLut, Vec_IntSize(vLeaves), Vec_IntSize(vNodes), Vec_IntSize(vRoots), Count ); 
    }
    Gia_ManComputeOneWin( pGia, -1, NULL, NULL, NULL, NULL );
}